

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O2

void __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>::
removeVertexFromSet(STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>
                    *this,void *ptr,int idx)

{
  size_type sVar1;
  int local_c;
  
  local_c = idx;
  sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)ptr,&local_c);
  if (sVar1 != 0) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)ptr,
               &local_c);
  }
  return;
}

Assistant:

void STLSetImplement<Set, Base>::removeVertexFromSet(void *ptr, int idx) {
	Set *__ptr__ = (Set*) ptr;
	if (__ptr__ -> count(idx)) __ptr__ -> erase(idx);
}